

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_setAllocator(PHYSFS_Allocator *a)

{
  if (initialized == '\x01') {
    PHYSFS_setErrorCode(PHYSFS_ERR_IS_INITIALIZED);
    return 0;
  }
  externalAllocator = (uint)(a != (PHYSFS_Allocator *)0x0);
  if (a != (PHYSFS_Allocator *)0x0) {
    __PHYSFS_AllocatorHooks.Free = a->Free;
    __PHYSFS_AllocatorHooks.Init = a->Init;
    __PHYSFS_AllocatorHooks.Deinit = a->Deinit;
    __PHYSFS_AllocatorHooks.Malloc = a->Malloc;
    __PHYSFS_AllocatorHooks.Realloc = a->Realloc;
  }
  return 1;
}

Assistant:

int PHYSFS_setAllocator(const PHYSFS_Allocator *a)
{
    BAIL_IF(initialized, PHYSFS_ERR_IS_INITIALIZED, 0);
    externalAllocator = (a != NULL);
    if (externalAllocator)
        memcpy(&allocator, a, sizeof (PHYSFS_Allocator));

    return 1;
}